

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O2

float __thiscall nv::FloatImage::sampleNearestRepeat(FloatImage *this,float x,float y,int c)

{
  ushort uVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = floorf(x);
  uVar1 = this->m_width;
  fVar3 = floorf(y);
  return this->m_mem
         [(c * (uint)this->m_height + (int)((float)this->m_height * (y - fVar3))) * (uint)uVar1 +
          (int)((float)uVar1 * (x - fVar2))];
}

Assistant:

float FloatImage::sampleNearestRepeat(const float x, const float y, const int c) const
{
	int ix = iround(frac(x) * m_width);
	int iy = iround(frac(y) * m_height);
	return pixel(ix, iy, c);
}